

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

void anon_unknown.dwarf_f6ec::cmakemainMessageCallback(string *m,cmMessageMetadata *md,cmake *cm)

{
  ostream *poVar1;
  cmake *cm_00;
  string local_30;
  
  cmsysTerminal_cfprintf(md->desiredColor,(FILE *)_stderr,"%s",(m->_M_dataplus)._M_p);
  fflush(_stderr);
  (anonymous_namespace)::cmakemainGetStack_abi_cxx11_(&local_30,(_anonymous_namespace_ *)cm,cm_00);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_30);
  std::operator<<(poVar1,'\n');
  std::ostream::flush();
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmakemainMessageCallback(const std::string& m,
                              const cmMessageMetadata& md, cmake* cm)
{
#if defined(_WIN32)
  // FIXME: On Windows we replace cerr's streambuf with a custom
  // implementation that converts our internal UTF-8 encoding to the
  // console's encoding.  It also does *not* replace LF with CRLF.
  // Since stderr does not convert encoding and does convert LF, we
  // cannot use it to print messages.  Another implementation will
  // be needed to print colored messages on Windows.
  static_cast<void>(md);
  std::cerr << m << cmakemainGetStack(cm) << '\n' << std::flush;
#else
  cmsysTerminal_cfprintf(md.desiredColor, stderr, "%s", m.c_str());
  fflush(stderr); // stderr is buffered in some cases.
  std::cerr << cmakemainGetStack(cm) << '\n' << std::flush;
#endif
}